

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O0

Diagnostics * __thiscall
slang::ast::ScriptSession::getDiagnostics(Diagnostics *__return_storage_ptr__,ScriptSession *this)

{
  bool bVar1;
  __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  Diagnostics *pDVar2;
  SourceManager *sourceManager;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *__range2;
  ScriptSession *this_local;
  Diagnostics *result;
  
  Diagnostics::Diagnostics(__return_storage_ptr__);
  __end2 = std::
           vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ::begin(&this->syntaxTrees);
  tree = (shared_ptr<slang::syntax::SyntaxTree> *)
         std::
         vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
         ::end(&this->syntaxTrees);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                                     *)&tree), bVar1) {
    this_00 = (__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                 ::operator*(&__end2);
    this_01 = std::
              __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    pDVar2 = slang::syntax::SyntaxTree::diagnostics(this_01);
    SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>
              ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,pDVar2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
    ::operator++(&__end2);
  }
  pDVar2 = Compilation::getAllDiagnostics(&this->compilation);
  SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,pDVar2);
  pDVar2 = EvalContext::getDiagnostics(&this->evalContext);
  SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,pDVar2);
  sourceManager = slang::syntax::SyntaxTree::getDefaultSourceManager();
  Diagnostics::sort(__return_storage_ptr__,sourceManager);
  return __return_storage_ptr__;
}

Assistant:

Diagnostics ScriptSession::getDiagnostics() {
    Diagnostics result;
    for (auto& tree : syntaxTrees)
        result.append(tree->diagnostics());

    result.append(compilation.getAllDiagnostics());
    result.append(evalContext.getDiagnostics());
    result.sort(SyntaxTree::getDefaultSourceManager());
    return result;
}